

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

deUint32 __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestTexture::getGLTargetType(SRGBTestTexture *this)

{
  SRGBTestTexture *this_local;
  
  if (this->m_targetType == TEXTURETYPE_2D) {
    this_local._4_4_ = 0xde1;
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

deUint32 SRGBTestTexture::getGLTargetType (void) const
{
	switch (m_targetType)
	{
		case TEXTURETYPE_2D:
		{
			return GL_TEXTURE_2D;
		}
		default:
		{
			DE_FATAL("Error: Target type not recognised");
			return -1;
		}
	}
}